

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-platform.c
# Opt level: O0

int free_region(yescrypt_region_t *region)

{
  int iVar1;
  yescrypt_region_t *in_RDI;
  int local_4;
  
  if ((in_RDI->base == (void *)0x0) || (iVar1 = munmap(in_RDI->base,in_RDI->base_size), iVar1 == 0))
  {
    init_region(in_RDI);
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int
free_region(yescrypt_region_t * region)
{
	if (region->base) {
#ifdef MAP_ANON
		if (munmap(region->base, region->base_size))
			return -1;
#else
		free(region->base);
#endif
	}
	init_region(region);
	return 0;
}